

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::RegisterObject
          (CSharedMemoryObjectManager *this,CPalThread *pthr,IPalObject *pobjToRegister,
          CAllowedObjectTypes *paot,DWORD dwRightsRequested,HANDLE *pHandle,
          IPalObject **ppobjRegistered)

{
  long lVar1;
  _LIST_ENTRY *p_Var2;
  bool bVar3;
  int iVar4;
  PAL_ERROR PVar5;
  BOOL BVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CAllowedObjectTypes *pCVar8;
  SHMPTR shmptr;
  undefined8 *puVar9;
  LPVOID pvVar10;
  char *pcVar11;
  void *local_70;
  VOID *pvImmutableData;
  IPalObject *local_60;
  IPalObject *pobjExisting;
  long local_50;
  int local_48;
  DWORD local_44;
  CAllowedObjectTypes *local_40;
  undefined4 local_34;
  long lVar7;
  
  local_44 = dwRightsRequested;
  local_40 = paot;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xee);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (pobjToRegister == (IPalObject *)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xef);
    fprintf(_stderr,"Expression: NULL != pobjToRegister\n");
  }
  if (local_40 == (CAllowedObjectTypes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xf0);
    fprintf(_stderr,"Expression: NULL != paot\n");
  }
  if (pHandle == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xf1);
    fprintf(_stderr,"Expression: NULL != pHandle\n");
  }
  if (ppobjRegistered == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0xf2);
    fprintf(_stderr,"Expression: NULL != ppobjRegistered\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_001357a3;
  iVar4 = (*pobjToRegister->_vptr_IPalObject[1])(pobjToRegister);
  lVar7 = CONCAT44(extraout_var,iVar4);
  pobjExisting = (IPalObject *)pHandle;
  if (lVar7 == 0) {
    fprintf(_stderr,"] %s %s:%d","RegisterObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x101);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  lVar1 = *(long *)(lVar7 + 0x10);
  if (lVar1 == 0) {
    local_34 = 0;
  }
  else {
    local_34 = (undefined4)CONCAT71((int7)((ulong)lVar1 >> 8),*(int *)(lVar1 + 0x10) != 0);
  }
  iVar4 = (**pobjToRegister->_vptr_IPalObject)(pobjToRegister);
  local_50 = CONCAT44(extraout_var_00,iVar4);
  iVar4 = (*pobjToRegister->_vptr_IPalObject[9])(pobjToRegister);
  pvImmutableData = &this->m_csListLock;
  InternalEnterCriticalSection(pthr,(PCRITICAL_SECTION)pvImmutableData);
  if (iVar4 == 1) {
    SHMLock();
  }
  local_48 = iVar4;
  if (*(int *)(lVar7 + 8) == 0) {
    p_Var2 = (this->m_leAnonymousObjects).Blink;
    pobjToRegister[0x1d]._vptr_IPalObject = (_func_int **)&this->m_leAnonymousObjects;
    pobjToRegister[0x1e]._vptr_IPalObject = (_func_int **)p_Var2;
    p_Var2->Flink = (_LIST_ENTRY *)(pobjToRegister + 0x1d);
    (this->m_leAnonymousObjects).Blink = (_LIST_ENTRY *)(pobjToRegister + 0x1d);
LAB_00135600:
    if ((local_48 == 1) && (*(int *)(local_50 + 0x18) != 0)) {
      PVar5 = (*pobjToRegister->_vptr_IPalObject[2])(pobjToRegister,&local_70);
      if (PVar5 == 0) {
        pvVar10 = SHMPtrToPtr((SHMPTR)pobjToRegister[0x20]._vptr_IPalObject);
        if (pvVar10 == (LPVOID)0x0) {
          fprintf(_stderr,"] %s %s:%d","RegisterObject",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                  ,0x1b0);
          pcVar11 = "Failure to map pshmobj->GetShmObjData()\n";
        }
        else {
          pvVar10 = SHMPtrToPtr(*(SHMPTR *)((long)pvVar10 + 0x20));
          if (pvVar10 != (LPVOID)0x0) {
            memcpy(pvVar10,local_70,(ulong)*(uint *)(local_50 + 0x18));
            bVar3 = true;
            goto LAB_00135725;
          }
          fprintf(_stderr,"] %s %s:%d","RegisterObject",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                  ,0x1a9);
          pcVar11 = "Failure to map psmod->shmObjImmutableData\n";
        }
        bVar3 = false;
        fprintf(_stderr,pcVar11);
        PVar5 = 0x54f;
      }
      else {
        fprintf(_stderr,"] %s %s:%d","RegisterObject",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                ,0x195);
        bVar3 = false;
        fprintf(_stderr,"Failure to obtain object immutable data\n");
      }
LAB_00135725:
      if (!bVar3) goto LAB_0013575d;
    }
    PVar5 = (**(code **)(*(long *)this + 0x18))
                      (this,pthr,pobjToRegister,local_44,(undefined1)local_34,0,pobjExisting);
    if (PVar5 == 0) {
      *ppobjRegistered = pobjToRegister;
      pobjToRegister = (IPalObject *)0x0;
    }
  }
  else {
    if (iVar4 != 1) {
      fprintf(_stderr,"] %s %s:%d","RegisterObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x11f);
      fprintf(_stderr,"Expression: fShared\n");
    }
    PVar5 = (**(code **)(*(long *)this + 0x10))(this,pthr,lVar7,local_40,&local_60);
    bVar3 = true;
    if (PVar5 == 0x7b) {
      p_Var2 = (this->m_leNamedObjects).Blink;
      pobjToRegister[0x1d]._vptr_IPalObject = (_func_int **)&this->m_leNamedObjects;
      pobjToRegister[0x1e]._vptr_IPalObject = (_func_int **)p_Var2;
      p_Var2->Flink = (_LIST_ENTRY *)(pobjToRegister + 0x1d);
      (this->m_leNamedObjects).Blink = (_LIST_ENTRY *)(pobjToRegister + 0x1d);
      pCVar8 = (CAllowedObjectTypes *)SHMPtrToPtr((SHMPTR)pobjToRegister[0x20]._vptr_IPalObject);
      if (pCVar8 == (CAllowedObjectTypes *)0x0) {
        fprintf(_stderr,"] %s %s:%d","RegisterObject",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                ,0x15e);
        pcVar11 = "Failure to map shared object data\n";
      }
      else {
        local_40 = pCVar8;
        shmptr = SHMGetInfo(SIID_NAMED_OBJECTS);
        if (shmptr != 0) {
          puVar9 = (undefined8 *)SHMPtrToPtr(shmptr);
          if (puVar9 == (undefined8 *)0x0) {
            fprintf(_stderr,"] %s %s:%d","RegisterObject",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                    ,0x170);
            fprintf(_stderr,"Failure to map shared object data\n");
            PVar5 = 0x54f;
            bVar3 = true;
            goto LAB_001355f8;
          }
          *(SHMPTR *)(local_40->m_rgfAllowedTypes + 8) = shmptr;
          *puVar9 = pobjToRegister[0x20]._vptr_IPalObject;
        }
        local_40[1].m_rgfAllowedTypes[6] = true;
        local_40[1].m_rgfAllowedTypes[7] = false;
        local_40[1].m_rgfAllowedTypes[8] = false;
        local_40[1].m_rgfAllowedTypes[9] = false;
        BVar6 = SHMSetInfo(SIID_NAMED_OBJECTS,(SHMPTR)pobjToRegister[0x20]._vptr_IPalObject);
        bVar3 = false;
        if (BVar6 != 0) goto LAB_001355f8;
        fprintf(_stderr,"] %s %s:%d","RegisterObject",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                ,0x17a);
        pcVar11 = "Failed to set shared named object list head\n";
      }
      fprintf(_stderr,pcVar11);
      PVar5 = 0x54f;
LAB_001355f3:
      bVar3 = true;
    }
    else if (PVar5 == 0) {
      PVar5 = (**(code **)(*(long *)this + 0x18))
                        (this,pthr,local_60,local_44,(undefined1)local_34,0,pobjExisting);
      if (PVar5 == 0) {
        *ppobjRegistered = local_60;
        PVar5 = 0xb7;
      }
      else {
        (*local_60->_vptr_IPalObject[8])(local_60,pthr);
      }
      goto LAB_001355f3;
    }
LAB_001355f8:
    if (!bVar3) goto LAB_00135600;
  }
LAB_0013575d:
  if (local_48 == 1) {
    SHMRelease();
  }
  InternalLeaveCriticalSection(pthr,(PCRITICAL_SECTION)pvImmutableData);
  if (pobjToRegister != (IPalObject *)0x0) {
    (*pobjToRegister->_vptr_IPalObject[8])(pobjToRegister,pthr);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar5;
  }
LAB_001357a3:
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::RegisterObject(
    CPalThread *pthr,
    IPalObject *pobjToRegister,
    CAllowedObjectTypes *paot,
    DWORD dwRightsRequested,
    HANDLE *pHandle,                 // OUT
    IPalObject **ppobjRegistered     // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    CSharedMemoryObject *pshmobj = static_cast<CSharedMemoryObject*>(pobjToRegister);
    SHMObjData *psmodNew = NULL;
    CObjectAttributes *poa;
    CObjectType *potObj;
    IPalObject *pobjExisting;
    BOOL fInherit = FALSE;
    BOOL fShared = FALSE;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != pobjToRegister);
    _ASSERTE(NULL != paot);
    _ASSERTE(NULL != pHandle);
    _ASSERTE(NULL != ppobjRegistered);

    ENTRY("CSharedMemoryObjectManager::RegisterObject "
        "(this=%p, pthr=%p, pobjToRegister=%p, paot=%p, "
        "dwRightsRequested=%d, pHandle=%p, ppobjRegistered=%p)\n",
        this,
        pthr,
        pobjToRegister,
        paot,
        dwRightsRequested,
        pHandle,
        ppobjRegistered
        );

    poa = pobjToRegister->GetObjectAttributes();
    _ASSERTE(NULL != poa);

    if (NULL != poa->pSecurityAttributes)
    {
        fInherit = poa->pSecurityAttributes->bInheritHandle;
    }

    potObj = pobjToRegister->GetObjectType();
    fShared = (SharedObject == pshmobj->GetObjectDomain());
    
    InternalEnterCriticalSection(pthr, &m_csListLock);

    if (fShared)
    {
        //
        // We only need to acquire the shared memory lock if this
        // object is actually shared.
        //
        
        SHMLock();
    }

    if (0 != poa->sObjectName.GetStringLength())
    {
        SHMPTR shmObjectListHead = SHMNULL;

        //
        // The object must be shared
        //

        _ASSERTE(fShared);
        
        //
        // Check if an object by this name already exists
        //

        palError = LocateObject(
            pthr,
            &poa->sObjectName,
            paot,
            &pobjExisting
            );

        if (NO_ERROR == palError)
        {
            //
            // Obtain a new handle to the existing object
            //

            palError = ObtainHandleForObject(
                pthr,
                pobjExisting,
                dwRightsRequested,
                fInherit,
                NULL, 
                pHandle
                );

            if (NO_ERROR == palError)
            {
                //
                // Transfer object reference to out param
                //

                *ppobjRegistered = pobjExisting;
                palError = ERROR_ALREADY_EXISTS;
            }
            else
            {
                pobjExisting->ReleaseReference(pthr);
            }

            goto RegisterObjectExit;
        }
        else if (ERROR_INVALID_NAME != palError)
        {
            //
            // Something different than an object not found error
            // occurred. This is most likely due to a type conflict.
            //

            goto RegisterObjectExit;
        }

        //
        // Insert the object on the named object lists
        //

        InsertTailList(&m_leNamedObjects, pshmobj->GetObjectListLink());

        psmodNew = SHMPTR_TO_TYPED_PTR(SHMObjData, pshmobj->GetShmObjData());
        if (NULL == psmodNew)
        {
            ASSERT("Failure to map shared object data\n");
            palError = ERROR_INTERNAL_ERROR;
            goto RegisterObjectExit;
        }

        shmObjectListHead = SHMGetInfo(SIID_NAMED_OBJECTS);
        if (SHMNULL != shmObjectListHead)
        {
            SHMObjData *psmodListHead;
            
            psmodListHead = SHMPTR_TO_TYPED_PTR(SHMObjData, shmObjectListHead);
            if (NULL != psmodListHead)
            {
                psmodNew->shmNextObj = shmObjectListHead;
                psmodListHead->shmPrevObj = pshmobj->GetShmObjData();
            }
            else
            {
                ASSERT("Failure to map shared object data\n");
                palError = ERROR_INTERNAL_ERROR;
                goto RegisterObjectExit;
            }
        }

        psmodNew->fAddedToList = TRUE;

        if (!SHMSetInfo(SIID_NAMED_OBJECTS, pshmobj->GetShmObjData()))
        {
            ASSERT("Failed to set shared named object list head\n");
            palError = ERROR_INTERNAL_ERROR;
            goto RegisterObjectExit;
        }
    }
    else
    {
        //
        // Place the object on the anonymous object list
        //

        InsertTailList(&m_leAnonymousObjects, pshmobj->GetObjectListLink());
    }

    //
    // Hoist the object's immutable data (if any) into shared memory if
    // the object is shared
    //

    if (fShared && 0 != potObj->GetImmutableDataSize())
    {
        VOID *pvImmutableData;
        SHMObjData *psmod;

        palError = pobjToRegister->GetImmutableData(&pvImmutableData);
        if (NO_ERROR != palError)
        {
            ASSERT("Failure to obtain object immutable data\n");
            goto RegisterObjectExit;
        }

        psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, pshmobj->GetShmObjData());
        if (NULL != psmod)
        {
            VOID *pvSharedImmutableData =
                SHMPTR_TO_TYPED_PTR(VOID, psmod->shmObjImmutableData);
            
            if (NULL != pvSharedImmutableData)
            {
                CopyMemory(
                    pvSharedImmutableData,
                    pvImmutableData,
                    potObj->GetImmutableDataSize()
                    );
            }
            else
            {
                ASSERT("Failure to map psmod->shmObjImmutableData\n");
                palError = ERROR_INTERNAL_ERROR;
                goto RegisterObjectExit;
            }
        }
        else
        {
            ASSERT("Failure to map pshmobj->GetShmObjData()\n");
            palError = ERROR_INTERNAL_ERROR;
            goto RegisterObjectExit;
        }
    }

    //
    // Obtain a handle for the new object
    //

    palError = ObtainHandleForObject(
        pthr,
        pobjToRegister,
        dwRightsRequested,
        fInherit,
        NULL, 
        pHandle
        );

    if (NO_ERROR == palError)
    {
        //
        // Transfer pobjToRegister reference to out param
        //

        *ppobjRegistered = pobjToRegister;
        pobjToRegister = NULL;
    }
        
RegisterObjectExit:

    if (fShared)
    {
        SHMRelease();
    }
    
    InternalLeaveCriticalSection(pthr, &m_csListLock);

    if (NULL != pobjToRegister)
    {
        pobjToRegister->ReleaseReference(pthr);
    }

    LOGEXIT("CSharedMemoryObjectManager::RegisterObject return %d\n", palError);

    return palError;
}